

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O1

void cplus::memory::testMemory_dark_magic(void)

{
  undefined1 uVar1;
  int value;
  int value_00;
  double value_01;
  OutputStream *pOVar2;
  long lVar3;
  int b;
  int constB;
  int constA;
  int a;
  double d2;
  double constD2;
  double constD1;
  double d1;
  Test test1;
  Test constTest1;
  Test test2;
  Test constTest2;
  int local_4d0;
  undefined4 local_4cc;
  undefined4 local_4c8;
  int local_4c4;
  double local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  double local_4a8;
  double local_4a0;
  undefined **local_498;
  int iStack_490;
  undefined4 uStack_48c;
  double dStack_488;
  int iStack_480;
  undefined4 uStack_47c;
  double dStack_478;
  undefined **local_470;
  int iStack_468;
  undefined4 uStack_464;
  double dStack_460;
  int iStack_458;
  undefined4 uStack_454;
  double dStack_450;
  undefined **local_448;
  undefined8 uStack_440;
  double dStack_438;
  undefined8 uStack_430;
  double dStack_428;
  undefined **local_418;
  undefined8 uStack_410;
  double dStack_408;
  undefined8 uStack_400;
  double dStack_3f8;
  Test local_3f0;
  Test local_3c8;
  Test local_3a0;
  Test local_378;
  Test local_350;
  Test local_328;
  Test local_300;
  Test local_2d8;
  Test local_2b0;
  Test local_288;
  Test local_260;
  Test local_238;
  Test local_210;
  Test local_1e8;
  Test local_1c0;
  Test local_198;
  Test local_170;
  Test local_148;
  Test local_120;
  Test local_f8;
  Test local_d0;
  Test local_a8;
  Test local_80;
  Test local_58;
  
  local_4c4 = 1;
  local_4d0 = 2;
  local_4a8 = 1.0;
  local_4c0 = 2.0;
  local_4c8 = 1;
  local_4cc = 2;
  local_4b0 = 0x3ff0000000000000;
  local_4b8 = 0x4000000000000000;
  local_498 = &PTR_toString_00124ae0;
  iStack_490 = 1;
  dStack_488 = 1.0;
  iStack_480 = 1;
  dStack_478 = 1.0;
  local_448 = &PTR_toString_00124ae0;
  uStack_440._0_4_ = 2;
  dStack_438 = 2.0;
  uStack_430._0_4_ = 2;
  dStack_428 = 2.0;
  local_470 = &PTR_toString_00124ae0;
  iStack_468 = 1;
  dStack_460 = 1.0;
  iStack_458 = 1;
  dStack_450 = 1.0;
  local_418 = &PTR_toString_00124ae0;
  uStack_410._0_4_ = 2;
  dStack_408 = 2.0;
  uStack_400._0_4_ = 2;
  dStack_3f8 = 2.0;
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"swap test:");
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_4d0 + lVar3);
    *(undefined1 *)((long)&local_4d0 + lVar3) = *(undefined1 *)((long)&local_4c4 + lVar3);
    *(undefined1 *)((long)&local_4c4 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4c4);
  pOVar2 = system::OutputStream::operator<<(pOVar2," b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4d0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_4d0 + lVar3);
    *(undefined1 *)((long)&local_4d0 + lVar3) = *(undefined1 *)((long)&local_4c4 + lVar3);
    *(undefined1 *)((long)&local_4c4 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4c4);
  pOVar2 = system::OutputStream::operator<<(pOVar2," b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4d0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1.0);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2.0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_4c0 + lVar3);
    *(undefined1 *)((long)&local_4c0 + lVar3) = *(undefined1 *)((long)&local_4a8 + lVar3);
    *(undefined1 *)((long)&local_4a8 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4a8);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4c0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_4c0 + lVar3);
    *(undefined1 *)((long)&local_4c0 + lVar3) = *(undefined1 *)((long)&local_4a8 + lVar3);
    *(undefined1 *)((long)&local_4a8 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  local_4a0 = local_4a8;
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4a8);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4c0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," const b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_4cc + lVar3);
    *(undefined1 *)((long)&local_4cc + lVar3) = *(undefined1 *)((long)&local_4c8 + lVar3);
    *(undefined1 *)((long)&local_4c8 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," const b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_4cc + lVar3);
    *(undefined1 *)((long)&local_4cc + lVar3) = *(undefined1 *)((long)&local_4c8 + lVar3);
    *(undefined1 *)((long)&local_4c8 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," const b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1.0);
  pOVar2 = system::OutputStream::operator<<(pOVar2," const d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2.0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_4b8 + lVar3);
    *(undefined1 *)((long)&local_4b8 + lVar3) = *(undefined1 *)((long)&local_4b0 + lVar3);
    *(undefined1 *)((long)&local_4b0 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1.0);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2.0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_4b8 + lVar3);
    *(undefined1 *)((long)&local_4b8 + lVar3) = *(undefined1 *)((long)&local_4b0 + lVar3);
    *(undefined1 *)((long)&local_4b0 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4a0);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2.0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  local_58.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_58._12_4_ = uStack_48c;
  local_58.i = iStack_490;
  local_58._28_4_ = uStack_47c;
  local_58.constI = iStack_480;
  local_58.d = dStack_488;
  local_58.constDouble = dStack_478;
  operator<<(pOVar2,&local_58);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"test2:");
  local_80.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_80.i = (int)uStack_440;
  local_80._12_4_ = uStack_440._4_4_;
  local_80.d = dStack_438;
  local_80.constI = (int)uStack_430;
  local_80._28_4_ = uStack_430._4_4_;
  local_80.constDouble = dStack_428;
  operator<<(pOVar2,&local_80);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_448 + lVar3);
    *(undefined1 *)((long)&local_448 + lVar3) = *(undefined1 *)((long)&local_498 + lVar3);
    *(undefined1 *)((long)&local_498 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x28);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  local_a8.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_a8._12_4_ = uStack_48c;
  local_a8.i = iStack_490;
  local_a8._28_4_ = uStack_47c;
  local_a8.constI = iStack_480;
  local_a8.d = dStack_488;
  local_a8.constDouble = dStack_478;
  operator<<(pOVar2,&local_a8);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"test2:");
  local_d0.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_d0.i = (int)uStack_440;
  local_d0._12_4_ = uStack_440._4_4_;
  local_d0.d = dStack_438;
  local_d0.constI = (int)uStack_430;
  local_d0._28_4_ = uStack_430._4_4_;
  local_d0.constDouble = dStack_428;
  operator<<(pOVar2,&local_d0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_448 + lVar3);
    *(undefined1 *)((long)&local_448 + lVar3) = *(undefined1 *)((long)&local_498 + lVar3);
    *(undefined1 *)((long)&local_498 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x28);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  local_f8.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_f8._12_4_ = uStack_48c;
  local_f8.i = iStack_490;
  local_f8._28_4_ = uStack_47c;
  local_f8.constI = iStack_480;
  local_f8.d = dStack_488;
  local_f8.constDouble = dStack_478;
  operator<<(pOVar2,&local_f8);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"test2:");
  local_120.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_120.i = (int)uStack_440;
  local_120._12_4_ = uStack_440._4_4_;
  local_120.d = dStack_438;
  local_120.constI = (int)uStack_430;
  local_120._28_4_ = uStack_430._4_4_;
  local_120.constDouble = dStack_428;
  operator<<(pOVar2,&local_120);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  local_148.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_148._12_4_ = uStack_464;
  local_148.i = iStack_468;
  local_148._28_4_ = uStack_454;
  local_148.constI = iStack_458;
  local_148.d = dStack_460;
  local_148.constDouble = dStack_450;
  operator<<(pOVar2,&local_148);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"const test2:");
  local_170.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_170.i = (int)uStack_410;
  local_170._12_4_ = uStack_410._4_4_;
  local_170.d = dStack_408;
  local_170.constI = (int)uStack_400;
  local_170._28_4_ = uStack_400._4_4_;
  local_170.constDouble = dStack_3f8;
  operator<<(pOVar2,&local_170);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_418 + lVar3);
    *(undefined1 *)((long)&local_418 + lVar3) = *(undefined1 *)((long)&local_470 + lVar3);
    *(undefined1 *)((long)&local_470 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x28);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  local_198.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_198._12_4_ = uStack_464;
  local_198.i = iStack_468;
  local_198._28_4_ = uStack_454;
  local_198.constI = iStack_458;
  local_198.d = dStack_460;
  local_198.constDouble = dStack_450;
  operator<<(pOVar2,&local_198);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"const test2:");
  local_1c0.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_1c0.i = (int)uStack_410;
  local_1c0._12_4_ = uStack_410._4_4_;
  local_1c0.d = dStack_408;
  local_1c0.constI = (int)uStack_400;
  local_1c0._28_4_ = uStack_400._4_4_;
  local_1c0.constDouble = dStack_3f8;
  operator<<(pOVar2,&local_1c0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_418 + lVar3);
    *(undefined1 *)((long)&local_418 + lVar3) = *(undefined1 *)((long)&local_470 + lVar3);
    *(undefined1 *)((long)&local_470 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x28);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  local_1e8.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_1e8._12_4_ = uStack_464;
  local_1e8.i = iStack_468;
  local_1e8._28_4_ = uStack_454;
  local_1e8.constI = iStack_458;
  local_1e8.d = dStack_460;
  local_1e8.constDouble = dStack_450;
  operator<<(pOVar2,&local_1e8);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"const test2:");
  local_210.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_210.i = (int)uStack_410;
  local_210._12_4_ = uStack_410._4_4_;
  local_210.d = dStack_408;
  local_210.constI = (int)uStack_400;
  local_210._28_4_ = uStack_400._4_4_;
  local_210.constDouble = dStack_3f8;
  operator<<(pOVar2,&local_210);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"copy test:");
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  value = local_4c4;
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4c4);
  pOVar2 = system::OutputStream::operator<<(pOVar2," b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4d0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  local_4d0 = value;
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,value);
  pOVar2 = system::OutputStream::operator<<(pOVar2," b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,value);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  value_00 = local_4c4;
  local_4d0 = local_4c4;
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,value);
  pOVar2 = system::OutputStream::operator<<(pOVar2," b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,value_00);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  local_4a0 = local_4a8;
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4a8);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4c0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  local_4c0 = local_4a0;
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4a0);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4a0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  value_01 = local_4a8;
  local_4c0 = local_4a8;
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4a0);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,value_01);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," const b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_4cc + lVar3);
    *(undefined1 *)((long)&local_4cc + lVar3) = *(undefined1 *)((long)&local_4c8 + lVar3);
    *(undefined1 *)((long)&local_4c8 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," const b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_4cc + lVar3);
    *(undefined1 *)((long)&local_4cc + lVar3) = *(undefined1 *)((long)&local_4c8 + lVar3);
    *(undefined1 *)((long)&local_4c8 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const a:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1);
  pOVar2 = system::OutputStream::operator<<(pOVar2," const b:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1.0);
  pOVar2 = system::OutputStream::operator<<(pOVar2," const d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2.0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_4b8 + lVar3);
    *(undefined1 *)((long)&local_4b8 + lVar3) = *(undefined1 *)((long)&local_4b0 + lVar3);
    *(undefined1 *)((long)&local_4b0 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,1.0);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2.0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_4b8 + lVar3);
    *(undefined1 *)((long)&local_4b8 + lVar3) = *(undefined1 *)((long)&local_4b0 + lVar3);
    *(undefined1 *)((long)&local_4b0 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"d1:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,local_4a0);
  pOVar2 = system::OutputStream::operator<<(pOVar2," d2:");
  pOVar2 = system::OutputStream::operator<<(pOVar2,2.0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  local_238.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_238._12_4_ = uStack_48c;
  local_238.i = iStack_490;
  local_238._28_4_ = uStack_47c;
  local_238.constI = iStack_480;
  local_238.d = dStack_488;
  local_238.constDouble = dStack_478;
  operator<<(pOVar2,&local_238);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"test2:");
  local_260.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_260.i = (int)uStack_440;
  local_260._12_4_ = uStack_440._4_4_;
  local_260.d = dStack_438;
  local_260.constI = (int)uStack_430;
  local_260._28_4_ = uStack_430._4_4_;
  local_260.constDouble = dStack_428;
  operator<<(pOVar2,&local_260);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  uStack_440 = CONCAT44(uStack_48c,iStack_490);
  uStack_430 = CONCAT44(uStack_47c,iStack_480);
  local_448 = local_498;
  dStack_438 = dStack_488;
  dStack_428 = dStack_478;
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  local_288.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_288._12_4_ = uStack_48c;
  local_288.i = iStack_490;
  local_288._28_4_ = uStack_47c;
  local_288.constI = iStack_480;
  local_288.d = dStack_488;
  local_288.constDouble = dStack_478;
  operator<<(pOVar2,&local_288);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"test2:");
  local_2b0.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_2b0._12_4_ = uStack_48c;
  local_2b0.i = iStack_490;
  local_2b0._28_4_ = uStack_47c;
  local_2b0.constI = iStack_480;
  local_2b0.d = dStack_488;
  local_2b0.constDouble = dStack_478;
  operator<<(pOVar2,&local_2b0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  uStack_440 = CONCAT44(uStack_48c,iStack_490);
  uStack_430 = CONCAT44(uStack_47c,iStack_480);
  local_448 = local_498;
  dStack_438 = dStack_488;
  dStack_428 = dStack_478;
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"test1:");
  local_2d8.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_2d8._12_4_ = uStack_48c;
  local_2d8.i = iStack_490;
  local_2d8._28_4_ = uStack_47c;
  local_2d8.constI = iStack_480;
  local_2d8.d = dStack_488;
  local_2d8.constDouble = dStack_478;
  operator<<(pOVar2,&local_2d8);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"test2:");
  local_300.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_300._12_4_ = uStack_48c;
  local_300.i = iStack_490;
  local_300._28_4_ = uStack_47c;
  local_300.constI = iStack_480;
  local_300.d = dStack_488;
  local_300.constDouble = dStack_478;
  operator<<(pOVar2,&local_300);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  local_328.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_328._12_4_ = uStack_464;
  local_328.i = iStack_468;
  local_328._28_4_ = uStack_454;
  local_328.constI = iStack_458;
  local_328.d = dStack_460;
  local_328.constDouble = dStack_450;
  operator<<(pOVar2,&local_328);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"const test2:");
  local_350.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_350.i = (int)uStack_410;
  local_350._12_4_ = uStack_410._4_4_;
  local_350.d = dStack_408;
  local_350.constI = (int)uStack_400;
  local_350._28_4_ = uStack_400._4_4_;
  local_350.constDouble = dStack_3f8;
  operator<<(pOVar2,&local_350);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  uStack_410 = CONCAT44(uStack_464,iStack_468);
  uStack_400 = CONCAT44(uStack_454,iStack_458);
  local_418 = local_470;
  dStack_408 = dStack_460;
  dStack_3f8 = dStack_450;
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  local_378.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_378._12_4_ = uStack_464;
  local_378.i = iStack_468;
  local_378._28_4_ = uStack_454;
  local_378.constI = iStack_458;
  local_378.d = dStack_460;
  local_378.constDouble = dStack_450;
  operator<<(pOVar2,&local_378);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"const test2:");
  local_3a0.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_3a0._12_4_ = uStack_464;
  local_3a0.i = iStack_468;
  local_3a0._28_4_ = uStack_454;
  local_3a0.constI = iStack_458;
  local_3a0.d = dStack_460;
  local_3a0.constDouble = dStack_450;
  operator<<(pOVar2,&local_3a0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  uStack_410 = CONCAT44(uStack_464,iStack_468);
  uStack_400 = CONCAT44(uStack_454,iStack_458);
  local_418 = local_470;
  dStack_408 = dStack_460;
  dStack_3f8 = dStack_450;
  pOVar2 = system::OutputStream::operator<<((OutputStream *)system::sout,"const test1:");
  local_3c8.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_3c8._12_4_ = uStack_464;
  local_3c8.i = iStack_468;
  local_3c8._28_4_ = uStack_454;
  local_3c8.constI = iStack_458;
  local_3c8.d = dStack_460;
  local_3c8.constDouble = dStack_450;
  operator<<(pOVar2,&local_3c8);
  pOVar2 = system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  pOVar2 = system::OutputStream::operator<<(pOVar2,"const test2:");
  local_3f0.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124ae0;
  local_3f0._12_4_ = uStack_464;
  local_3f0.i = iStack_468;
  local_3f0._28_4_ = uStack_454;
  local_3f0.constI = iStack_458;
  local_3f0.d = dStack_460;
  local_3f0.constDouble = dStack_450;
  operator<<(pOVar2,&local_3f0);
  system::OutputStream::operator<<(pOVar2,(Object *)system::endl);
  return;
}

Assistant:

void testMemory_dark_magic() {
			/**
			 * 定义测试用变量
			 */
			int a = 1, b = 2;
			double d1 = 1.0;
			double d2 = 2.0;
			const int constA = 1, constB = 2;
			const double constD1 = 1.0, constD2 = 2.0;
			Test test1(1, 1, 1, 1), test2(2, 2, 2, 2);
			const Test constTest1(1, 1, 1, 1), constTest2(2, 2, 2, 2);
			/**
			 * swap test start
			 */
			//提示开始swap方法测试
			sout << "swap test:" << endl;
			//输出测试前变量的状态
			sout << "a:" << a << " b:" << b << endl;
			//测试非const变量的__SWAP宏
			__SWAP(a, b)
			sout << "a:" << a << " b:" << b << endl;
			//测试非const变量的swap函数
			::cplus::memory::swap(a, b);
			sout << "a:" << a << " b:" << b << endl;
			
			//输出测试前变量的状态
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			//测试非const变量的__SWAP宏
			__SWAP(d1, d2)
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			//测试非const变量的swap函数
			::cplus::memory::swap(d1, d2);
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			
			//输出测试前变量的状态
			sout << "const a:" << constA << " const b:" << constB << endl;
			//测试const变量的__SWAP宏
			__SWAP(constA, constB)
			sout << "const a:" << constA << " const b:" << constB << endl;
			//测试const变量的swap函数
			::cplus::memory::swap(constA, constB);
			sout << "const a:" << constA << " const b:" << constB << endl;
			
			//输出测试前变量的状态
			sout << "const d1:" << constD1 << " const d2:" << constD2 << endl;
			//测试const变量的__SWAP宏
			__SWAP(constD1, constD2)
			sout << "d1:" << constD1 << " d2:" << constD2 << endl;
			//测试const变量的swap函数
			::cplus::memory::swap(constD1, constD2);
			sout << "d1:" << d1 << " d2:" << constD2 << endl;
			
			//输出测试前变量的状态
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			//测试非const变量的__SWAP宏
			__SWAP(test1, test2)
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			//测试非const变量的swap函数
			::cplus::memory::swap(test1, test2);
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			
			//输出测试前变量的状态
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			//测试const变量的__SWAP宏
			__SWAP(constTest1, constTest2)
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			//测试const变量的swap函数
			::cplus::memory::swap(constTest1, constTest2);
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			/**
			 * swap test end
			 */
			
			/**
			 * copy test start
			 */
			//提示开始copy方法测试
			sout << endl << "copy test:" << endl;
			
			//输出测试前变量的状态
			sout << "a:" << a << " b:" << b << endl;
			//测试非const变量的__COPY宏
			__COPY(a, b)
			sout << "a:" << a << " b:" << b << endl;
			//测试非const变量的copy函数
			::cplus::memory::copy(a, b);
			sout << "a:" << a << " b:" << b << endl;
			
			//输出测试前变量的状态
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			//测试非const变量的__COPY宏
			__COPY(d1, d2)
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			//测试非const变量的copy函数
			::cplus::memory::copy(d1, d2);
			sout << "d1:" << d1 << " d2:" << d2 << endl;
			
			
			//输出测试前变量的状态
			sout << "const a:" << constA << " const b:" << constB << endl;
			//测试const变量的__COPY宏
			__SWAP(constA, constB)
			sout << "const a:" << constA << " const b:" << constB << endl;
			//测试const变量的copy函数
			::cplus::memory::swap(constA, constB);
			sout << "const a:" << constA << " const b:" << constB << endl;
			
			//输出测试前变量的状态
			sout << "const d1:" << constD1 << " const d2:" << constD2 << endl;
			//测试const变量的__COPY宏
			__SWAP(constD1, constD2)
			sout << "d1:" << constD1 << " d2:" << constD2 << endl;
			//测试const变量的copy函数
			::cplus::memory::swap(constD1, constD2);
			sout << "d1:" << d1 << " d2:" << constD2 << endl;
			
			//输出测试前变量的状态
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			//测试非const变量的__COPY宏
			__COPY(test1, test2)
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			//测试非const变量的copy函数
			::cplus::memory::copy(test1, test2);
			sout << "test1:" << test1 << endl << "test2:" << test2 << endl;
			
			//输出测试前变量的状态
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			//测试const变量的__COPY宏
			__COPY(constTest1, constTest2)
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			//测试const变量的copy函数
			::cplus::memory::copy(constTest1, constTest2);
			sout << "const test1:" << constTest1 << endl << "const test2:" << constTest2 << endl;
			/**
			 * copy test end
			 */
		}